

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O3

RayTracerConfig * RayTracerConfig::defaultConfig(void)

{
  pointer *ppSVar1;
  vector<Plane,_std::allocator<Plane>_> *this;
  pointer *ppPVar2;
  iterator __position;
  undefined3 uVar3;
  iterator iVar4;
  RayTracerConfig *in_RDI;
  undefined1 local_3c [16];
  undefined8 local_2c;
  float fStack_24;
  RGB RStack_20;
  undefined1 uStack_1d;
  float local_1c;
  
  (in_RDI->super_BaseConfig).background.r = '\0';
  (in_RDI->super_BaseConfig).background.g = '\0';
  (in_RDI->super_BaseConfig).background.b = '\0';
  (in_RDI->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (in_RDI->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->super_BaseConfig).antiAliasing = 2;
  (in_RDI->super_BaseConfig).maxRecursionLevel = 1;
  (in_RDI->super_BaseConfig).ambientCoefficient = 0.1;
  (in_RDI->super_BaseConfig).imageX = 0x200;
  (in_RDI->super_BaseConfig).imageY = 0x300;
  (in_RDI->super_BaseConfig).imageZ = 0x400;
  (in_RDI->super_BaseConfig).observer.x = 0.0;
  (in_RDI->super_BaseConfig).observer.y = 0.0;
  *(undefined8 *)&(in_RDI->super_BaseConfig).observer.z = 0x447a000000000000;
  (in_RDI->super_BaseConfig).light.y = 2000.0;
  (in_RDI->super_BaseConfig).light.z = 2500.0;
  local_3c._0_4_ = 2500.0;
  local_3c._4_4_ = -200.0;
  local_3c._8_4_ = -600.0;
  local_3c._12_4_ = 600.0;
  local_2c._0_1_ = 200;
  local_2c._1_1_ = '\0';
  local_2c._2_1_ = '\0';
  local_2c._4_4_ = 0.3;
  std::vector<Sphere,_std::allocator<Sphere>_>::_M_realloc_insert<Sphere>
            (&in_RDI->spheres,(iterator)0x0,(Sphere *)local_3c);
  __position._M_current =
       (in_RDI->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_3c._0_4_ = 2000.0;
  local_3c._4_4_ = 0.0;
  local_3c._8_4_ = 800.0;
  local_3c._12_4_ = 400.0;
  local_2c._0_1_ = '\0';
  local_2c._1_1_ = 200;
  local_2c._2_1_ = '\0';
  local_2c._4_4_ = 0.1;
  if (__position._M_current ==
      (in_RDI->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Sphere,_std::allocator<Sphere>_>::_M_realloc_insert<Sphere>
              (&in_RDI->spheres,__position,(Sphere *)local_3c);
  }
  else {
    *(undefined8 *)&(__position._M_current)->color = local_2c;
    ((__position._M_current)->center).x = 2000.0;
    ((__position._M_current)->center).y = 0.0;
    *(undefined8 *)&((__position._M_current)->center).z = 0x43c8000044480000;
    ppSVar1 = &(in_RDI->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this = &in_RDI->planes;
  local_3c._0_4_ = 6000.0;
  local_3c._4_4_ = 0.0;
  local_3c._8_4_ = 0.0;
  local_3c._12_4_ = -1.0;
  local_2c._0_4_ = 0.0;
  local_2c._4_4_ = 0.0;
  fStack_24 = 6000.0;
  RStack_20.r = 0xff;
  RStack_20.g = 0xff;
  RStack_20.b = 0xff;
  local_1c = 1.0;
  iVar4._M_current =
       (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Plane,_std::allocator<Plane>_>::_M_realloc_insert<Plane>
              (this,iVar4,(Plane *)local_3c);
    iVar4._M_current =
         (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar4._M_current)->reflectionCoefficient = 1.0;
    ((iVar4._M_current)->normal).y = 0.0;
    ((iVar4._M_current)->normal).z = 0.0;
    uVar3 = (undefined3)(0xffffff45bb8000 >> 0x20);
    (iVar4._M_current)->d = (float)(int)0xffffff45bb8000;
    ((iVar4._M_current)->color).r = (char)uVar3;
    ((iVar4._M_current)->color).g = (char)((uint3)uVar3 >> 8);
    ((iVar4._M_current)->color).b = (char)((uint3)uVar3 >> 0x10);
    (iVar4._M_current)->field_0x1f = uStack_1d;
    ((iVar4._M_current)->P).x = 6000.0;
    ((iVar4._M_current)->P).y = 0.0;
    *(undefined8 *)&((iVar4._M_current)->P).z = 0xbf80000000000000;
    iVar4._M_current =
         (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_3c._0_4_ = -2000.0;
  local_3c._4_4_ = 0.0;
  local_3c._8_4_ = 0.0;
  local_3c._12_4_ = 1.0;
  local_2c._0_4_ = 0.0;
  local_2c._4_4_ = 0.0;
  fStack_24 = 2000.0;
  RStack_20.r = 0xf5;
  RStack_20.g = 0xde;
  RStack_20.b = 0xb3;
  local_1c = 0.0;
  if (iVar4._M_current ==
      (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Plane,_std::allocator<Plane>_>::_M_realloc_insert<Plane>
              (this,iVar4,(Plane *)local_3c);
    iVar4._M_current =
         (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar4._M_current)->reflectionCoefficient = 0.0;
    ((iVar4._M_current)->normal).y = 0.0;
    ((iVar4._M_current)->normal).z = 0.0;
    uVar3 = (undefined3)(0xb3def544fa0000 >> 0x20);
    (iVar4._M_current)->d = (float)(int)0xb3def544fa0000;
    ((iVar4._M_current)->color).r = (char)uVar3;
    ((iVar4._M_current)->color).g = (char)((uint3)uVar3 >> 8);
    ((iVar4._M_current)->color).b = (char)((uint3)uVar3 >> 0x10);
    (iVar4._M_current)->field_0x1f = uStack_1d;
    ((iVar4._M_current)->P).x = -2000.0;
    ((iVar4._M_current)->P).y = 0.0;
    *(undefined8 *)&((iVar4._M_current)->P).z = 0x3f80000000000000;
    iVar4._M_current =
         (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_3c._0_4_ = 0.0;
  local_3c._4_4_ = 3000.0;
  local_3c._8_4_ = 0.0;
  local_3c._12_4_ = 0.0;
  local_2c._0_4_ = -1.0;
  local_2c._4_4_ = 0.0;
  fStack_24 = 3000.0;
  RStack_20.r = 0xff;
  RStack_20.g = 'i';
  RStack_20.b = 0xb4;
  local_1c = 0.05;
  if (iVar4._M_current ==
      (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Plane,_std::allocator<Plane>_>::_M_realloc_insert<Plane>
              (this,iVar4,(Plane *)local_3c);
    iVar4._M_current =
         (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar4._M_current)->reflectionCoefficient = 0.05;
    ((iVar4._M_current)->normal).y = -1.0;
    ((iVar4._M_current)->normal).z = 0.0;
    uVar3 = (undefined3)(0xb469ff453b8000 >> 0x20);
    (iVar4._M_current)->d = (float)(int)0xb469ff453b8000;
    ((iVar4._M_current)->color).r = (char)uVar3;
    ((iVar4._M_current)->color).g = (char)((uint3)uVar3 >> 8);
    ((iVar4._M_current)->color).b = (char)((uint3)uVar3 >> 0x10);
    (iVar4._M_current)->field_0x1f = uStack_1d;
    ((iVar4._M_current)->P).x = 0.0;
    ((iVar4._M_current)->P).y = 3000.0;
    *(undefined8 *)&((iVar4._M_current)->P).z = 0;
    iVar4._M_current =
         (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_3c._0_4_ = 0.0;
  local_3c._4_4_ = -800.0;
  local_3c._8_4_ = 0.0;
  local_3c._12_4_ = 0.0;
  local_2c._0_4_ = 1.0;
  local_2c._4_4_ = 0.0;
  fStack_24 = 800.0;
  RStack_20.r = 'd';
  RStack_20.g = 'd';
  RStack_20.b = 200;
  local_1c = 0.05;
  if (iVar4._M_current ==
      (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Plane,_std::allocator<Plane>_>::_M_realloc_insert<Plane>
              (this,iVar4,(Plane *)local_3c);
    iVar4._M_current =
         (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar4._M_current)->reflectionCoefficient = 0.05;
    ((iVar4._M_current)->normal).y = 1.0;
    ((iVar4._M_current)->normal).z = 0.0;
    uVar3 = (undefined3)(0xc8646444480000 >> 0x20);
    (iVar4._M_current)->d = (float)(int)0xc8646444480000;
    ((iVar4._M_current)->color).r = (char)uVar3;
    ((iVar4._M_current)->color).g = (char)((uint3)uVar3 >> 8);
    ((iVar4._M_current)->color).b = (char)((uint3)uVar3 >> 0x10);
    (iVar4._M_current)->field_0x1f = uStack_1d;
    ((iVar4._M_current)->P).x = 0.0;
    ((iVar4._M_current)->P).y = -800.0;
    *(undefined8 *)&((iVar4._M_current)->P).z = 0;
    iVar4._M_current =
         (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_3c._0_4_ = 0.0;
  local_3c._4_4_ = 0.0;
  local_3c._8_4_ = -2500.0;
  local_3c._12_4_ = 0.0;
  local_2c._0_4_ = 0.0;
  local_2c._4_4_ = 1.0;
  fStack_24 = 2500.0;
  RStack_20.r = ' ';
  RStack_20.g = 0xb2;
  RStack_20.b = 0xaa;
  local_1c = 0.05;
  if (iVar4._M_current ==
      (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Plane,_std::allocator<Plane>_>::_M_realloc_insert<Plane>
              (this,iVar4,(Plane *)local_3c);
    iVar4._M_current =
         (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar4._M_current)->reflectionCoefficient = 0.05;
    ((iVar4._M_current)->normal).y = 0.0;
    ((iVar4._M_current)->normal).z = 1.0;
    uVar3 = (undefined3)(0xaab220451c4000 >> 0x20);
    (iVar4._M_current)->d = (float)(int)0xaab220451c4000;
    ((iVar4._M_current)->color).r = (char)uVar3;
    ((iVar4._M_current)->color).g = (char)((uint3)uVar3 >> 8);
    ((iVar4._M_current)->color).b = (char)((uint3)uVar3 >> 0x10);
    (iVar4._M_current)->field_0x1f = uStack_1d;
    ((iVar4._M_current)->P).x = 0.0;
    ((iVar4._M_current)->P).y = 0.0;
    *(undefined8 *)&((iVar4._M_current)->P).z = 0xc51c4000;
    iVar4._M_current =
         (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_3c._0_4_ = 0.0;
  local_3c._4_4_ = 0.0;
  local_3c._8_4_ = 3500.0;
  local_3c._12_4_ = 0.0;
  local_2c._0_4_ = 0.0;
  local_2c._4_4_ = -1.0;
  fStack_24 = 3500.0;
  RStack_20.r = ' ';
  RStack_20.g = 0xb2;
  RStack_20.b = 0xaa;
  local_1c = 0.05;
  if (iVar4._M_current ==
      (in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Plane,_std::allocator<Plane>_>::_M_realloc_insert<Plane>
              (this,iVar4,(Plane *)local_3c);
  }
  else {
    (iVar4._M_current)->reflectionCoefficient = 0.05;
    ((iVar4._M_current)->normal).y = 0.0;
    ((iVar4._M_current)->normal).z = -1.0;
    uVar3 = (undefined3)(0xaab220455ac000 >> 0x20);
    (iVar4._M_current)->d = (float)(int)0xaab220455ac000;
    ((iVar4._M_current)->color).r = (char)uVar3;
    ((iVar4._M_current)->color).g = (char)((uint3)uVar3 >> 8);
    ((iVar4._M_current)->color).b = (char)((uint3)uVar3 >> 0x10);
    (iVar4._M_current)->field_0x1f = uStack_1d;
    ((iVar4._M_current)->P).x = 0.0;
    ((iVar4._M_current)->P).y = 0.0;
    *(undefined8 *)&((iVar4._M_current)->P).z = 0x455ac000;
    ppPVar2 = &(in_RDI->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppPVar2 = *ppPVar2 + 1;
  }
  return in_RDI;
}

Assistant:

RayTracerConfig RayTracerConfig::defaultConfig()
{
  RayTracerConfig config;

  config.antiAliasing = 2;
  config.maxRecursionLevel = 1;
  config.ambientCoefficient = 0.1;
  config.imageX = 512;
  config.imageY = 384 * 2;
  config.imageZ = 512 * 2;
  config.observer = {0, 0, 0};
  config.light = {1000, 2000, 2500};

  // red
  config.spheres.push_back({{2500, -200, -600}, 600, {200, 0, 0}, 0.3});
  // green
  config.spheres.push_back({{2000, 0, 800}, 400, {0, 200, 0}, 0.1});

  // Plane has one face!
  // front
  config.planes.push_back({{6000, 0, 0}, {-1, 0, 0}, 6000, {255, 255, 255}, 1});
  // back
  config.planes.push_back({{-2000, 0, 0}, {1, 0, 0}, 2000, {245, 222, 179}});
  // top
  config.planes.push_back({{0, 3000, 0}, {0, -1, 0}, 3000, {255, 105, 180}, 0.05});
  // bottom
  config.planes.push_back({{0, -800, 0}, {0, 1, 0}, 800, {100, 100, 200}, 0.05});
  // left
  config.planes.push_back({{0, 0, -2500}, {0, 0, 1}, 2500, {32, 178, 170}, 0.05});
  // right
  config.planes.push_back({{0, 0, 3500}, {0, 0, -1}, 3500, {32, 178, 170}, 0.05});

  return config;
}